

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double digamma(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (x <= 0.0) {
    return 0.0;
  }
  if (x <= 1e-06) {
    return x * 1.6449340668482264 + -1.0 / x + 0.5772156649015329;
  }
  dVar4 = 0.0;
  if (x < 8.5) {
    do {
      dVar4 = dVar4 - 1.0 / x;
      x = x + 1.0;
    } while (x < 8.5);
  }
  dVar2 = 1.0 / x;
  dVar1 = log(x);
  dVar3 = -dVar2 * dVar2;
  return dVar1 + dVar4 + dVar2 * -0.5 +
         ((((dVar3 * 0.007575757575757576 + 0.004166666666666667) * dVar3 + 0.003968253968253968) *
           dVar3 + 0.008333333333333333) * dVar3 + 0.08333333333333333) * dVar3;
}

Assistant:

double digamma ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    DIGAMMA calculates the digamma or Psi function.
//
//  Discussion:
//
//    DiGamma ( X ) = d ( log ( Gamma ( X ) ) ) / dX
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 March 2016
//
//  Author:
//
//    Original FORTRAN77 by J Bernardo.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    J Bernardo,
//    Algorithm AS 103:
//    Psi ( Digamma ) Function,
//    Applied Statistics,
//    Volume 25, Number 3, pages 315-317, 1976.
//
//  Parameters:
//
//    Input, double X, the argument of the digamma function.
//    0 < X.
//
//    Output, double DIGAMMA, the value of the digamma function at X.
//
{
  double c = 8.5;
  double euler_mascheroni = - 0.57721566490153286060;
  double r;
  double value;
  double x2;
//
//  Check the input.
//
  if ( x <= 0.0 )
  {
    value = 0.0;
    return value;
  }
//
//  Use approximation for small argument.
//
  if ( x <= 0.000001 )
  {
    value = - euler_mascheroni - 1.0 / x + 1.6449340668482264365 * x;
    return value;
  }
//
//  Reduce to DIGAMA(X + N).
//
  value = 0.0;
  x2 = x;
  while ( x2 < c )
  {
    value = value - 1.0 / x2;
    x2 = x2 + 1.0;
  }
//
//  Use Stirling's (actually de Moivre's) expansion.
//
  r = 1.0 / x2;
  value = value + log ( x2 ) - 0.5 * r;

  r = r * r;

  value = value 
    - r * ( 1.0 / 12.0 
    - r * ( 1.0 / 120.0 
    - r * ( 1.0 / 252.0 
    - r * ( 1.0 / 240.0
    - r * ( 1.0 / 132.0 ) ) ) ) );

  return value;
}